

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::
PerformDefaultAction
          (FunctionMocker<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *this,
          ArgumentTuple *args,string *call_description)

{
  Result RVar1;
  OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *this_00;
  Action<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *this_01;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int> local_3c;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)> *)0x0) {
    std::operator+(&local_60,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    RVar1 = DefaultValue<int>::Get();
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    this_01 = OnCallSpec<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::GetAction(this_00);
    std::_Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>::_Tuple_impl
              (&local_3c,&args->super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>)
    ;
    RVar1 = Action<int_(int,_int,_int,_int,_int,_int,_int,_int,_int)>::Perform
                      (this_01,(ArgumentTuple *)&local_3c);
  }
  return RVar1;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }